

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O1

void AlphaReplace_SSE2(uint32_t *src,int length,uint32_t color)

{
  uint *puVar1;
  uint32_t *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  
  uVar12 = 0;
  if (7 < length) {
    uVar11 = 0;
    do {
      puVar1 = src + uVar11;
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      puVar3 = src + uVar11 + 4;
      uVar7 = *puVar3;
      uVar8 = puVar3[1];
      uVar9 = puVar3[2];
      uVar10 = puVar3[3];
      uVar14 = -(uint)(-0x7f000001 < (int)(*puVar1 ^ 0x80000000));
      uVar15 = -(uint)(-0x7f000001 < (int)(uVar4 ^ 0x80000000));
      uVar16 = -(uint)(-0x7f000001 < (int)(uVar5 ^ 0x80000000));
      uVar17 = -(uint)(-0x7f000001 < (int)(uVar6 ^ 0x80000000));
      uVar18 = -(uint)(-0x7f000001 < (int)(uVar7 ^ 0x80000000));
      uVar19 = -(uint)(-0x7f000001 < (int)(uVar8 ^ 0x80000000));
      uVar20 = -(uint)(-0x7f000001 < (int)(uVar9 ^ 0x80000000));
      uVar21 = -(uint)(-0x7f000001 < (int)(uVar10 ^ 0x80000000));
      puVar2 = src + uVar11;
      *puVar2 = ~uVar14 & color | *puVar1 & uVar14;
      puVar2[1] = ~uVar15 & color | uVar4 & uVar15;
      puVar2[2] = ~uVar16 & color | uVar5 & uVar16;
      puVar2[3] = ~uVar17 & color | uVar6 & uVar17;
      puVar2 = src + uVar11 + 4;
      *puVar2 = ~uVar18 & color | uVar7 & uVar18;
      puVar2[1] = ~uVar19 & color | uVar8 & uVar19;
      puVar2[2] = ~uVar20 & color | uVar9 & uVar20;
      puVar2[3] = ~uVar21 & color | uVar10 & uVar21;
      uVar12 = uVar11 + 8;
      uVar13 = uVar11 + 0x10;
      uVar11 = uVar12;
    } while (uVar13 <= (uint)length);
  }
  if ((int)uVar12 < length) {
    uVar12 = uVar12 & 0xffffffff;
    do {
      if (src[uVar12] < 0x1000000) {
        src[uVar12] = color;
      }
      uVar12 = uVar12 + 1;
    } while ((uint)length != uVar12);
  }
  return;
}

Assistant:

static void AlphaReplace_SSE2(uint32_t* src, int length, uint32_t color) {
  const __m128i m_color = _mm_set1_epi32(color);
  const __m128i zero = _mm_setzero_si128();
  int i = 0;
  for (; i + 8 <= length; i += 8) {
    const __m128i a0 = _mm_loadu_si128((const __m128i*)(src + i + 0));
    const __m128i a1 = _mm_loadu_si128((const __m128i*)(src + i + 4));
    const __m128i b0 = _mm_srai_epi32(a0, 24);
    const __m128i b1 = _mm_srai_epi32(a1, 24);
    const __m128i c0 = _mm_cmpeq_epi32(b0, zero);
    const __m128i c1 = _mm_cmpeq_epi32(b1, zero);
    const __m128i d0 = _mm_and_si128(c0, m_color);
    const __m128i d1 = _mm_and_si128(c1, m_color);
    const __m128i e0 = _mm_andnot_si128(c0, a0);
    const __m128i e1 = _mm_andnot_si128(c1, a1);
    _mm_storeu_si128((__m128i*)(src + i + 0), _mm_or_si128(d0, e0));
    _mm_storeu_si128((__m128i*)(src + i + 4), _mm_or_si128(d1, e1));
  }
  for (; i < length; ++i) if ((src[i] >> 24) == 0) src[i] = color;
}